

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void NOPLL_WriteBuffered(opll_t *chip,uint32_t port,uint8_t data)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long local_38;
  uint64_t skip;
  int32_t buffer [2];
  uint64_t time2;
  uint64_t time1;
  uint8_t data_local;
  uint32_t port_local;
  opll_t *chip_local;
  
  if ((chip->writebuf[chip->writebuf_last].port & 4) != 0) {
    NOPLL_Write(chip,chip->writebuf[chip->writebuf_last].port & 3,
                chip->writebuf[chip->writebuf_last].data);
    chip->writebuf_cur = chip->writebuf_last + 1 & 0x7ff;
    uVar1 = chip->writebuf[chip->writebuf_last].time;
    uVar2 = chip->writebuf_samplecnt;
    chip->writebuf_samplecnt = chip->writebuf[chip->writebuf_last].time;
    local_38 = uVar1 - uVar2;
    while (local_38 != 0) {
      NOPLL_Clock(chip,(int32_t *)&skip);
      local_38 = local_38 + -1;
    }
  }
  chip->writebuf[chip->writebuf_last].port = (byte)port & 3 | 4;
  chip->writebuf[chip->writebuf_last].data = data;
  time2 = chip->writebuf_lasttime + 0x14;
  if (time2 < chip->writebuf_samplecnt) {
    time2 = chip->writebuf_samplecnt;
  }
  chip->writebuf[chip->writebuf_last].time = time2;
  chip->writebuf_lasttime = time2;
  chip->writebuf_last = chip->writebuf_last + 1 & 0x7ff;
  return;
}

Assistant:

void NOPLL_WriteBuffered(opll_t* chip, uint32_t port, uint8_t data)
{
    uint64_t time1, time2;
    int32_t buffer[2];
    uint64_t skip;

    if (chip->writebuf[chip->writebuf_last].port & 0x04)
    {
        NOPLL_Write(chip, chip->writebuf[chip->writebuf_last].port & 0x03,
            chip->writebuf[chip->writebuf_last].data);

        chip->writebuf_cur = (chip->writebuf_last + 1) % OPLL_WRITEBUF_SIZE;
        skip = chip->writebuf[chip->writebuf_last].time - chip->writebuf_samplecnt;
        chip->writebuf_samplecnt = chip->writebuf[chip->writebuf_last].time;
        while (skip--)
        {
            NOPLL_Clock(chip, buffer);
        }
    }

    chip->writebuf[chip->writebuf_last].port = (port & 0x03) | 0x04;
    chip->writebuf[chip->writebuf_last].data = data;
    time1 = chip->writebuf_lasttime + OPLL_WRITEBUF_DELAY;
    time2 = chip->writebuf_samplecnt;

    if (time1 < time2)
    {
        time1 = time2;
    }

    chip->writebuf[chip->writebuf_last].time = time1;
    chip->writebuf_lasttime = time1;
    chip->writebuf_last = (chip->writebuf_last + 1) % OPLL_WRITEBUF_SIZE;
}